

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeThrow(TranslateToFuzzReader *this,Type type)

{
  Module *module;
  char *pcVar1;
  Tag *pTVar2;
  value_type *pvVar3;
  Type *pTVar4;
  uintptr_t *puVar5;
  Throw *pTVar6;
  Name NVar7;
  IString IVar8;
  HeapType local_70;
  Type local_68;
  Type tagType;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> operands;
  undefined1 local_38 [8];
  Iterator __begin1;
  
  if (type.id != 1) {
    __assert_fail("type == Type::unreachable",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x1438,"Expression *wasm::TranslateToFuzzReader::makeThrow(Type)");
  }
  if (this->trivialNesting == 0) {
    if ((this->wasm->tags).
        super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->wasm->tags).
        super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      addTag(this);
    }
    pvVar3 = Random::
             pick<std::vector<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>,std::allocator<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>>>>
                       (&this->random,&this->wasm->tags);
    pTVar2 = (pvVar3->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
             super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
  }
  else if ((this->trivialTag).super_IString.str._M_str == (char *)0x0) {
    module = this->wasm;
    NVar7.super_IString.str = (IString)::wasm::IString::interned(4,"tag$",0);
    IVar8.str = (string_view)Names::getValidTagName(module,NVar7);
    ::wasm::HeapType::HeapType(&local_70,(Signature)ZEXT816(0));
    auStack_58 = (undefined1  [8])operator_new(0x40);
    (((IString *)((long)auStack_58 + 0x30))->str)._M_len = 0;
    *(char **)((long)auStack_58 + 0x30U + 8) = (char *)0x0;
    (((IString *)auStack_58)->str)._M_len = 0;
    *(char **)((long)&((IString *)auStack_58)->str + 8) = (char *)0x0;
    (((IString *)((long)auStack_58 + 0x10))->str)._M_len = 0;
    *(char **)((long)auStack_58 + 0x10U + 8) = (char *)0x0;
    (((IString *)((long)auStack_58 + 0x20))->str)._M_len = 0;
    *(char **)((long)auStack_58 + 0x20U + 8) = (char *)0x0;
    *(char **)((long)auStack_58 + 0x30U + 8) = (char *)0x10;
    ((IString *)auStack_58)->str = IVar8.str;
    *(uintptr_t *)((long)auStack_58 + 0x30U + 8) = local_70.id;
    pTVar2 = (Tag *)::wasm::Module::addTag((unique_ptr *)this->wasm);
    pcVar1 = *(char **)((long)&(pTVar2->super_Importable).super_Named.name.super_IString.str + 8);
    (this->trivialTag).super_IString.str._M_len =
         (pTVar2->super_Importable).super_Named.name.super_IString.str._M_len;
    (this->trivialTag).super_IString.str._M_str = pcVar1;
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58,0x40);
    }
  }
  else {
    NVar7.super_IString.str._M_str = (char *)(this->trivialTag).super_IString.str._M_len;
    NVar7.super_IString.str._M_len = (size_t)this->wasm;
    pTVar2 = (Tag *)::wasm::Module::getTag(NVar7);
  }
  local_68.id = ::wasm::HeapType::getSignature();
  operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  local_38 = (undefined1  [8])&local_68;
  pTVar4 = (Type *)Type::size(&local_68);
  if (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent == pTVar4)
  goto LAB_0014c1e8;
  do {
    do {
      puVar5 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)local_38);
      tagType.id = (uintptr_t)make(this,*puVar5);
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_58,
                 (Expression **)&tagType);
      __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1);
    } while (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
             pTVar4);
LAB_0014c1e8:
  } while (local_38 != (undefined1  [8])&local_68);
  pTVar6 = Builder::makeThrow<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                     (&this->builder,
                      (IString)(pTVar2->super_Importable).super_Named.name.super_IString,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_58)
  ;
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    (long)operands.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
  }
  return (Expression *)pTVar6;
}

Assistant:

Expression* TranslateToFuzzReader::makeThrow(Type type) {
  assert(type == Type::unreachable);
  Tag* tag;
  if (trivialNesting) {
    // We are nested under a makeTrivial call, so only emit something trivial.
    // Get (or create) a trivial tag, so we have no operands (and will not call
    // make(), below). Otherwise, we might recurse very deeply if we threw a
    // tag that contains an exnref (for which we may end up creating yet another
    // throw in a try).
    if (!trivialTag) {
      auto newTag = builder.makeTag(Names::getValidTagName(wasm, "tag$"),
                                    Signature(Type::none, Type::none));
      tag = wasm.addTag(std::move(newTag));
      trivialTag = tag->name;
    } else {
      tag = wasm.getTag(trivialTag);
    }
  } else {
    // Get a random tag, adding a random one if necessary.
    if (wasm.tags.empty()) {
      addTag();
    }
    tag = pick(wasm.tags).get();
  }
  auto tagType = tag->params();
  std::vector<Expression*> operands;
  for (auto t : tagType) {
    operands.push_back(make(t));
  }
  return builder.makeThrow(tag, operands);
}